

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void prvTidyParseNoFrames(TidyDocImpl *doc,Node *noframes,GetTokenMode mode)

{
  Lexer *pLVar1;
  Bool BVar2;
  Node *pNVar3;
  Node *body;
  Node *pNStack_30;
  Bool seen_body;
  Node *node;
  Lexer *lexer;
  GetTokenMode mode_local;
  Node *noframes_local;
  TidyDocImpl *doc_local;
  
  pLVar1 = doc->lexer;
  if ((doc->config).value[1].v == 0) {
    doc->badAccess = doc->badAccess | 0x20;
  }
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          do {
            while( true ) {
              pNStack_30 = prvTidyGetToken(doc,IgnoreWhitespace);
              if (pNStack_30 == (Node *)0x0) {
                prvTidyReport(doc,noframes,(Node *)0x0,0x25a);
                return;
              }
              if ((pNStack_30->tag == noframes->tag) && (pNStack_30->type == EndTag)) {
                prvTidyFreeNode(doc,pNStack_30);
                noframes->closed = yes;
                TrimSpaces(doc,noframes);
                return;
              }
              if ((((pNStack_30 != (Node *)0x0) && (pNStack_30->tag != (Dict *)0x0)) &&
                  (pNStack_30->tag->id == TidyTag_FRAME)) ||
                 (((pNStack_30 != (Node *)0x0 && (pNStack_30->tag != (Dict *)0x0)) &&
                  (pNStack_30->tag->id == TidyTag_FRAMESET)))) {
                TrimSpaces(doc,noframes);
                if (pNStack_30->type == EndTag) {
                  prvTidyReport(doc,noframes,pNStack_30,0x235);
                  prvTidyFreeNode(doc,pNStack_30);
                  return;
                }
                prvTidyReport(doc,noframes,pNStack_30,0x259);
                prvTidyUngetToken(doc);
                return;
              }
              if (((pNStack_30 == (Node *)0x0) || (pNStack_30->tag == (Dict *)0x0)) ||
                 (pNStack_30->tag->id != TidyTag_HTML)) break;
              BVar2 = prvTidynodeIsElement(pNStack_30);
              if (BVar2 != no) {
                prvTidyReport(doc,noframes,pNStack_30,0x235);
              }
              prvTidyFreeNode(doc,pNStack_30);
            }
            BVar2 = InsertMisc(noframes,pNStack_30);
          } while (BVar2 != no);
          if ((((pNStack_30 == (Node *)0x0) || (pNStack_30->tag == (Dict *)0x0)) ||
              (pNStack_30->tag->id != TidyTag_BODY)) || (pNStack_30->type != StartTag)) break;
          BVar2 = pLVar1->seenEndBody;
          prvTidyInsertNodeAtEnd(noframes,pNStack_30);
          ParseTag(doc,pNStack_30,IgnoreWhitespace);
          if ((BVar2 != no) && (pNVar3 = prvTidyFindBody(doc), pNVar3 != pNStack_30)) {
            prvTidyCoerceNode(doc,pNStack_30,TidyTag_DIV,no,no);
            MoveNodeToBody(doc,pNStack_30);
          }
        }
        BVar2 = prvTidynodeIsText(pNStack_30);
        if ((BVar2 != no) || ((pNStack_30->tag != (Dict *)0x0 && (pNStack_30->type != EndTag))))
        break;
        prvTidyReport(doc,noframes,pNStack_30,0x235);
        prvTidyFreeNode(doc,pNStack_30);
      }
      pNVar3 = prvTidyFindBody(doc);
      if ((pNVar3 != (Node *)0x0) || (pLVar1->seenEndBody != no)) break;
      prvTidyUngetToken(doc);
      pNStack_30 = prvTidyInferredTag(doc,TidyTag_BODY);
      if ((int)(doc->config).value[100].v != 0) {
        prvTidyReport(doc,noframes,pNStack_30,0x247);
      }
      prvTidyInsertNodeAtEnd(noframes,pNStack_30);
LAB_0014c6b4:
      ParseTag(doc,pNStack_30,IgnoreWhitespace);
    }
    if (pNVar3 != (Node *)0x0) {
      BVar2 = prvTidynodeIsText(pNStack_30);
      if (BVar2 != no) {
        prvTidyUngetToken(doc);
        pNStack_30 = prvTidyInferredTag(doc,TidyTag_P);
        prvTidyReport(doc,noframes,pNStack_30,0x233);
      }
      prvTidyInsertNodeAtEnd(pNVar3,pNStack_30);
      goto LAB_0014c6b4;
    }
    prvTidyReport(doc,noframes,pNStack_30,0x235);
    prvTidyFreeNode(doc,pNStack_30);
  } while( true );
}

Assistant:

void TY_(ParseNoFrames)(TidyDocImpl* doc, Node *noframes, GetTokenMode mode)
{
    Lexer* lexer = doc->lexer;
    Node *node;

    if ( cfg(doc, TidyAccessibilityCheckLevel) == 0 )
    {
        doc->badAccess |=  BA_USING_NOFRAMES;
    }
    mode = IgnoreWhitespace;

    while ( (node = TY_(GetToken)(doc, mode)) != NULL )
    {
        if ( node->tag == noframes->tag && node->type == EndTag )
        {
            TY_(FreeNode)( doc, node);
            noframes->closed = yes;
            TrimSpaces(doc, noframes);
            return;
        }

        if ( nodeIsFRAME(node) || nodeIsFRAMESET(node) )
        {
            TrimSpaces(doc, noframes);
            if (node->type == EndTag)
            {
                TY_(Report)(doc, noframes, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);       /* Throw it away */
            }
            else
            {
                TY_(Report)(doc, noframes, node, MISSING_ENDTAG_BEFORE);
                TY_(UngetToken)( doc );
            }
            return;
        }

        if ( nodeIsHTML(node) )
        {
            if (TY_(nodeIsElement)(node))
                TY_(Report)(doc, noframes, node, DISCARDING_UNEXPECTED);

            TY_(FreeNode)( doc, node);
            continue;
        }

        /* deal with comments etc. */
        if (InsertMisc(noframes, node))
            continue;

        if ( nodeIsBODY(node) && node->type == StartTag )
        {
            Bool seen_body = lexer->seenEndBody;
            TY_(InsertNodeAtEnd)(noframes, node);
            ParseTag(doc, node, IgnoreWhitespace /*MixedContent*/);

            /* fix for bug http://tidy.sf.net/bug/887259 */
            if (seen_body && TY_(FindBody)(doc) != node)
            {
                TY_(CoerceNode)(doc, node, TidyTag_DIV, no, no);
                MoveNodeToBody(doc, node);
            }
            continue;
        }

        /* implicit body element inferred */
        if (TY_(nodeIsText)(node) || (node->tag && node->type != EndTag))
        {
            Node *body = TY_(FindBody)( doc );
            if ( body || lexer->seenEndBody )
            {
                if ( body == NULL )
                {
                    TY_(Report)(doc, noframes, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }
                if ( TY_(nodeIsText)(node) )
                {
                    TY_(UngetToken)( doc );
                    node = TY_(InferredTag)(doc, TidyTag_P);
                    TY_(Report)(doc, noframes, node, CONTENT_AFTER_BODY );
                }
                TY_(InsertNodeAtEnd)( body, node );
            }
            else
            {
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_BODY);
                if ( cfgBool(doc, TidyXmlOut) )
                    TY_(Report)(doc, noframes, node, INSERTING_TAG);
                TY_(InsertNodeAtEnd)( noframes, node );
            }

            ParseTag( doc, node, IgnoreWhitespace /*MixedContent*/ );
            continue;
        }

        /* discard unexpected end tags */
        TY_(Report)(doc, noframes, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }

    TY_(Report)(doc, noframes, node, MISSING_ENDTAG_FOR);
}